

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

int __thiscall QDialogPrivate::close(QDialogPrivate *this,int __fd)

{
  QDialogPrivate *this_00;
  int __fd_00;
  long in_FS_OFFSET;
  QDialog *q;
  CloseEventEater closeEventEater;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDialogPrivate *)q_func(this);
  QDialog::setResult((QDialog *)this_00,(int)((ulong)this >> 0x20));
  if ((*(uint *)&(this->super_QWidgetPrivate).data.field_0x10 >> 9 & 1) == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    close::CloseEventEater::CloseEventEater((CloseEventEater *)this_00);
    __fd_00 = (int)&local_18;
    QObject::installEventFilter((QObject *)this_00);
    QWidgetPrivate::close(&this->super_QWidgetPrivate,__fd_00);
    close::CloseEventEater::~CloseEventEater((CloseEventEater *)0x743229);
  }
  else {
    QWidget::hide((QWidget *)0x743235);
  }
  resetModalitySetByOpen(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDialogPrivate::close(int resultCode)
{
    Q_Q(QDialog);

    q->setResult(resultCode);

    if (!data.is_closing) {
        // Until Qt 6.3 we didn't close dialogs, so they didn't receive a QCloseEvent.
        // It is likely that subclasses implement closeEvent and handle them as rejection
        // (like QMessageBox and QProgressDialog do), so eat those events.
        struct CloseEventEater : QObject
        {
            using QObject::QObject;
        protected:
            bool eventFilter(QObject *o, QEvent *e) override
            {
                if (e->type() == QEvent::Close)
                    return true;
                return QObject::eventFilter(o, e);
            }
        } closeEventEater;
        q->installEventFilter(&closeEventEater);
        QWidgetPrivate::close();
    } else {
        // If the close was initiated outside of QDialog we will end up
        // here via QDialog::closeEvent calling reject(), in which case
        // we need to hide the dialog to ensure QDialog::closeEvent does
        // not ignore the close event. FIXME: Why is QDialog doing this?
        q->hide();
    }

    resetModalitySetByOpen();
}